

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::LRN_x86_fma::forward_inplace(LRN_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int *piVar13;
  pointer piVar14;
  Mat *pMVar15;
  _func_int **pp_Var16;
  ulong uVar17;
  Mat *pMVar18;
  int k;
  uint uVar19;
  _func_int *p_Var20;
  ulong uVar21;
  long lVar22;
  int j;
  _func_int ***ppp_Var23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  undefined1 (*pauVar27) [32];
  int iVar28;
  long lVar29;
  float *pfVar30;
  _func_int ***ppp_Var31;
  int iVar32;
  uint uVar33;
  int iVar34;
  void *pvVar35;
  int q;
  uint uVar36;
  int iVar37;
  float fVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  allocator_type local_199;
  Mat *local_198;
  LRN_x86_fma *local_190;
  Mat local_188;
  Mat *local_140;
  _func_int ***local_138;
  Mat *local_130;
  undefined1 local_128 [16];
  Mat local_118;
  Allocator *local_d0;
  void *local_c8;
  long local_c0;
  long local_b8;
  Mat *local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar19 = bottom_top_blob->w;
  local_198 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  uVar33 = bottom_top_blob->c;
  sVar2 = bottom_top_blob->elemsize;
  local_118.cstep = 0;
  local_118.data = (Allocator *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)local_118.data;
  local_118.dims = (int)local_118.refcount;
  local_118.w = local_118.refcount._4_4_;
  local_118._48_8_ = local_118.elemsize;
  local_118.c = local_118.elempack;
  Mat::create(&local_118,uVar19,bottom_top_blob->h,uVar33,sVar2,opt->workspace_allocator);
  iVar32 = -100;
  if (((Allocator *)local_118.data == (Allocator *)0x0) ||
     ((long)local_118.c * local_118.cstep == 0)) goto LAB_002db0ee;
  local_98._0_8_ = sVar2;
  local_128._0_8_ = opt;
  local_a0 = (long)(int)uVar19;
  iVar32 = (int)local_198 * uVar19;
  pMVar15 = (Mat *)0x0;
  local_140 = (Mat *)0x0;
  if (0 < (int)uVar33) {
    local_140 = (Mat *)(ulong)uVar33;
  }
  for (; pMVar15 != local_140; pMVar15 = (Mat *)((long)&pMVar15->data + 1)) {
    pvVar35 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pfVar30 = (float *)(sVar4 * (long)pMVar15 * sVar3 + (long)pvVar35);
    ppp_Var23 = (_func_int ***)
                ((long)(_func_int ***)local_118.data +
                local_118.cstep * (long)pMVar15 * local_118.elemsize);
    lVar25 = 0;
    for (iVar34 = 0; iVar34 + 7 < iVar32; iVar34 = iVar34 + 8) {
      auVar6._4_4_ = pfVar30[1] * pfVar30[1];
      auVar6._0_4_ = *pfVar30 * *pfVar30;
      auVar6._8_4_ = pfVar30[2] * pfVar30[2];
      auVar6._12_4_ = pfVar30[3] * pfVar30[3];
      auVar6._16_4_ = pfVar30[4] * pfVar30[4];
      auVar6._20_4_ = pfVar30[5] * pfVar30[5];
      auVar6._24_4_ = pfVar30[6] * pfVar30[6];
      auVar6._28_4_ = pfVar30[7];
      *(undefined1 (*) [32])ppp_Var23 = auVar6;
      pfVar30 = pfVar30 + 8;
      ppp_Var23 = ppp_Var23 + 4;
      lVar25 = lVar25 + 8;
    }
    for (; (int)lVar25 < iVar32; lVar25 = lVar25 + 1) {
      fVar38 = *(float *)((long)pvVar35 + lVar25 * 4 + sVar4 * sVar3 * (long)pMVar15);
      *(float *)((long)(_func_int ***)local_118.data +
                lVar25 * 4 + local_118.cstep * local_118.elemsize * (long)pMVar15) = fVar38 * fVar38
      ;
    }
  }
  pp_Var16 = this->_vptr_LRN_x86_fma;
  local_190 = this;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var16[-3]) == 0) {
    local_188.cstep = 0;
    local_188.data = (Allocator *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    Mat::create(&local_188,uVar19,(int)local_198,uVar33,sVar2,opt->workspace_allocator);
    if (((Allocator *)local_188.data == (Allocator *)0x0) ||
       (local_188.cstep * (long)local_188.c == 0)) {
      piVar13 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
      iVar32 = -100;
      if (piVar13 == (int *)0x0) goto LAB_002db0ee;
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 != 0) goto LAB_002db0ee;
      if (local_188.allocator != (Allocator *)0x0) {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        goto LAB_002db0ee;
      }
LAB_002db142:
      iVar32 = -100;
      free(local_188.data);
      goto LAB_002db0ee;
    }
    uVar19 = (int)local_188.cstep * local_188.c;
    uVar24 = 0;
    uVar17 = (ulong)uVar19;
    if ((int)uVar19 < 1) {
      uVar17 = uVar24;
    }
    for (; (int)uVar17 != (int)uVar24; uVar24 = uVar24 + 1) {
      *(undefined4 *)((long)(_func_int ***)local_188.data + uVar24 * 4) = 0;
    }
    pp_Var16 = this->_vptr_LRN_x86_fma;
    local_128._0_4_ =
         *(float *)(&this->field_0xd8 + (long)pp_Var16[-3]) /
         (float)*(int *)(&this->field_0xd4 + (long)pp_Var16[-3]);
    local_128._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar50 = vshufps_avx(local_128,local_128,0);
    local_98._16_16_ = auVar50;
    local_98._0_16_ = auVar50;
    local_138 = (_func_int ***)CONCAT44(local_138._4_4_,uVar33);
    local_130 = bottom_top_blob;
    for (pMVar15 = (Mat *)0x0; pvVar35 = local_188.data, pMVar15 != local_140;
        pMVar15 = (Mat *)((long)&pMVar15->data + 1)) {
      p_Var20 = pp_Var16[-3];
      iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var20);
      for (uVar19 = iVar34 / -2 + (int)pMVar15; (int)uVar19 <= iVar34 / 2 + (int)pMVar15;
          uVar19 = uVar19 + 1) {
        if ((int)uVar19 < (int)uVar33 && -1 < (int)uVar19) {
          ppp_Var31 = (_func_int ***)
                      ((long)(_func_int ***)local_118.data +
                      local_118.cstep * uVar19 * local_118.elemsize);
          lVar29 = local_188.cstep * (long)pMVar15 *
                   CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          ppp_Var23 = (_func_int ***)((long)(_func_int ***)local_188.data + lVar29);
          lVar25 = 0;
          for (iVar34 = 0; iVar34 + 7 < iVar32; iVar34 = iVar34 + 8) {
            auVar39._0_4_ = *(float *)ppp_Var23 + *(float *)ppp_Var31;
            auVar39._4_4_ = *(float *)((long)ppp_Var23 + 4) + *(float *)((long)ppp_Var31 + 4);
            auVar39._8_4_ = *(float *)(ppp_Var23 + 1) + *(float *)(ppp_Var31 + 1);
            auVar39._12_4_ =
                 *(float *)((long)(ppp_Var23 + 1) + 4) + *(float *)((long)(ppp_Var31 + 1) + 4);
            auVar39._16_4_ = *(float *)(ppp_Var23 + 2) + *(float *)(ppp_Var31 + 2);
            auVar39._20_4_ =
                 *(float *)((long)(ppp_Var23 + 2) + 4) + *(float *)((long)(ppp_Var31 + 2) + 4);
            auVar39._24_4_ = *(float *)(ppp_Var23 + 3) + *(float *)(ppp_Var31 + 3);
            auVar39._28_4_ =
                 *(float *)((long)(ppp_Var23 + 3) + 4) + *(float *)((long)(ppp_Var31 + 3) + 4);
            *(undefined1 (*) [32])ppp_Var23 = auVar39;
            ppp_Var31 = ppp_Var31 + 4;
            ppp_Var23 = ppp_Var23 + 4;
            lVar25 = lVar25 + 8;
          }
          for (; (int)lVar25 < iVar32; lVar25 = lVar25 + 1) {
            *(float *)((long)(_func_int ***)local_188.data + lVar25 * 4 + lVar29) =
                 *(float *)((long)(_func_int ***)local_188.data + lVar25 * 4 + lVar29) +
                 *(float *)((long)(_func_int ***)local_118.data +
                           lVar25 * 4 + local_118.cstep * local_118.elemsize * (ulong)uVar19);
          }
          p_Var20 = pp_Var16[-3];
          iVar34 = *(int *)(&local_190->field_0xd4 + (long)p_Var20);
          this = local_190;
        }
      }
      pvVar5 = local_130->data;
      sVar2 = local_130->elemsize;
      sVar3 = local_130->cstep;
      pauVar27 = (undefined1 (*) [32])(sVar3 * (long)pMVar15 * sVar2 + (long)pvVar5);
      ppp_Var23 = (_func_int ***)
                  ((long)(_func_int ***)local_188.data +
                  local_188.cstep * (long)pMVar15 *
                  CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize));
      uVar1 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var20);
      auVar40._4_4_ = uVar1;
      auVar40._0_4_ = uVar1;
      auVar40._8_4_ = uVar1;
      auVar40._12_4_ = uVar1;
      auVar40._16_4_ = uVar1;
      auVar40._20_4_ = uVar1;
      auVar40._24_4_ = uVar1;
      auVar40._28_4_ = uVar1;
      fVar38 = *(float *)(&this->field_0xdc + (long)p_Var20);
      uVar17 = CONCAT44(fVar38,fVar38) ^ 0x8000000080000000;
      lVar25 = 0;
      for (iVar34 = 0; iVar34 + 7 < iVar32; iVar34 = iVar34 + 8) {
        auVar10 = vfmadd132ps_fma(*(undefined1 (*) [32])ppp_Var23,auVar40,local_98);
        auVar42._8_4_ = 0x800000;
        auVar42._0_8_ = 0x80000000800000;
        auVar42._12_4_ = 0x800000;
        auVar42._16_4_ = 0x800000;
        auVar42._20_4_ = 0x800000;
        auVar42._24_4_ = 0x800000;
        auVar42._28_4_ = 0x800000;
        auVar6 = vmaxps_avx(ZEXT1632(auVar10),auVar42);
        auVar47 = vpsrld_avx(auVar6._0_16_,0x17);
        auVar50 = vpsrld_avx(auVar6._16_16_,0x17);
        auVar54._8_4_ = 0x807fffff;
        auVar54._0_8_ = 0x807fffff807fffff;
        auVar54._12_4_ = 0x807fffff;
        auVar54._16_4_ = 0x807fffff;
        auVar54._20_4_ = 0x807fffff;
        auVar54._24_4_ = 0x807fffff;
        auVar54._28_4_ = 0x807fffff;
        auVar6 = vandps_avx(auVar6,auVar54);
        auVar73._8_4_ = 0x3f000000;
        auVar73._0_8_ = 0x3f0000003f000000;
        auVar73._12_4_ = 0x3f000000;
        auVar73._16_4_ = 0x3f000000;
        auVar73._20_4_ = 0x3f000000;
        auVar73._24_4_ = 0x3f000000;
        auVar73._28_4_ = 0x3f000000;
        auVar9 = vorps_avx(auVar73,auVar6);
        auVar55._8_4_ = 0x3f3504f3;
        auVar55._0_8_ = 0x3f3504f33f3504f3;
        auVar55._12_4_ = 0x3f3504f3;
        auVar55._16_4_ = 0x3f3504f3;
        auVar55._20_4_ = 0x3f3504f3;
        auVar55._24_4_ = 0x3f3504f3;
        auVar55._28_4_ = 0x3f3504f3;
        auVar39 = vcmpps_avx(auVar55,auVar9,2);
        auVar6 = vandnps_avx(auVar39,auVar9);
        auVar43._0_4_ = auVar9._0_4_ + -1.0 + auVar6._0_4_;
        auVar43._4_4_ = auVar9._4_4_ + -1.0 + auVar6._4_4_;
        auVar43._8_4_ = auVar9._8_4_ + -1.0 + auVar6._8_4_;
        auVar43._12_4_ = auVar9._12_4_ + -1.0 + auVar6._12_4_;
        auVar43._16_4_ = auVar9._16_4_ + -1.0 + auVar6._16_4_;
        auVar43._20_4_ = auVar9._20_4_ + -1.0 + auVar6._20_4_;
        auVar43._24_4_ = auVar9._24_4_ + -1.0 + auVar6._24_4_;
        auVar43._28_4_ = auVar9._28_4_ + -1.0 + auVar6._28_4_;
        auVar50 = vpsubd_avx(auVar50,auVar39._16_16_);
        auVar63._8_4_ = 0xffffff81;
        auVar63._0_8_ = 0xffffff81ffffff81;
        auVar63._12_4_ = 0xffffff81;
        auVar50 = vpaddd_avx(auVar50,auVar63);
        auVar47 = vpsubd_avx(auVar47,auVar39._0_16_);
        auVar47 = vpaddd_avx(auVar47,auVar63);
        auVar49._16_16_ = auVar50;
        auVar49._0_16_ = auVar47;
        auVar51._0_4_ = auVar43._0_4_ * auVar43._0_4_;
        auVar51._4_4_ = auVar43._4_4_ * auVar43._4_4_;
        auVar51._8_4_ = auVar43._8_4_ * auVar43._8_4_;
        auVar51._12_4_ = auVar43._12_4_ * auVar43._12_4_;
        auVar51._16_4_ = auVar43._16_4_ * auVar43._16_4_;
        auVar51._20_4_ = auVar43._20_4_ * auVar43._20_4_;
        auVar51._24_4_ = auVar43._24_4_ * auVar43._24_4_;
        auVar51._28_4_ = 0;
        auVar56._8_4_ = 0x3d9021bb;
        auVar56._0_8_ = 0x3d9021bb3d9021bb;
        auVar56._12_4_ = 0x3d9021bb;
        auVar56._16_4_ = 0x3d9021bb;
        auVar56._20_4_ = 0x3d9021bb;
        auVar56._24_4_ = 0x3d9021bb;
        auVar56._28_4_ = 0x3d9021bb;
        auVar64._8_4_ = 0xbdebd1b8;
        auVar64._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar64._12_4_ = 0xbdebd1b8;
        auVar64._16_4_ = 0xbdebd1b8;
        auVar64._20_4_ = 0xbdebd1b8;
        auVar64._24_4_ = 0xbdebd1b8;
        auVar64._28_4_ = 0xbdebd1b8;
        auVar50 = vfmadd213ps_fma(auVar56,auVar43,auVar64);
        auVar65._8_4_ = 0x3def251a;
        auVar65._0_8_ = 0x3def251a3def251a;
        auVar65._12_4_ = 0x3def251a;
        auVar65._16_4_ = 0x3def251a;
        auVar65._20_4_ = 0x3def251a;
        auVar65._24_4_ = 0x3def251a;
        auVar65._28_4_ = 0x3def251a;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar43,auVar65);
        auVar66._8_4_ = 0xbdfe5d4f;
        auVar66._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar66._12_4_ = 0xbdfe5d4f;
        auVar66._16_4_ = 0xbdfe5d4f;
        auVar66._20_4_ = 0xbdfe5d4f;
        auVar66._24_4_ = 0xbdfe5d4f;
        auVar66._28_4_ = 0xbdfe5d4f;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar43,auVar66);
        auVar67._8_4_ = 0x3e11e9bf;
        auVar67._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar67._12_4_ = 0x3e11e9bf;
        auVar67._16_4_ = 0x3e11e9bf;
        auVar67._20_4_ = 0x3e11e9bf;
        auVar67._24_4_ = 0x3e11e9bf;
        auVar67._28_4_ = 0x3e11e9bf;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar43,auVar67);
        auVar68._8_4_ = 0xbe2aae50;
        auVar68._0_8_ = 0xbe2aae50be2aae50;
        auVar68._12_4_ = 0xbe2aae50;
        auVar68._16_4_ = 0xbe2aae50;
        auVar68._20_4_ = 0xbe2aae50;
        auVar68._24_4_ = 0xbe2aae50;
        auVar68._28_4_ = 0xbe2aae50;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar43,auVar68);
        auVar69._8_4_ = 0x3e4cceac;
        auVar69._0_8_ = 0x3e4cceac3e4cceac;
        auVar69._12_4_ = 0x3e4cceac;
        auVar69._16_4_ = 0x3e4cceac;
        auVar69._20_4_ = 0x3e4cceac;
        auVar69._24_4_ = 0x3e4cceac;
        auVar69._28_4_ = 0x3e4cceac;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar43,auVar69);
        auVar70._8_4_ = 0xbe7ffffc;
        auVar70._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar70._12_4_ = 0xbe7ffffc;
        auVar70._16_4_ = 0xbe7ffffc;
        auVar70._20_4_ = 0xbe7ffffc;
        auVar70._24_4_ = 0xbe7ffffc;
        auVar70._28_4_ = 0xbe7ffffc;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar43,auVar70);
        auVar71._8_4_ = 0x3eaaaaaa;
        auVar71._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar71._12_4_ = 0x3eaaaaaa;
        auVar71._16_4_ = 0x3eaaaaaa;
        auVar71._20_4_ = 0x3eaaaaaa;
        auVar71._24_4_ = 0x3eaaaaaa;
        auVar71._28_4_ = 0x3eaaaaaa;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar43,auVar71);
        auVar57._0_4_ = auVar51._0_4_ * auVar43._0_4_ * auVar50._0_4_;
        auVar57._4_4_ = auVar51._4_4_ * auVar43._4_4_ * auVar50._4_4_;
        auVar57._8_4_ = auVar51._8_4_ * auVar43._8_4_ * auVar50._8_4_;
        auVar57._12_4_ = auVar51._12_4_ * auVar43._12_4_ * auVar50._12_4_;
        auVar57._16_4_ = auVar51._16_4_ * auVar43._16_4_ * 0.0;
        auVar57._20_4_ = auVar51._20_4_ * auVar43._20_4_ * 0.0;
        auVar57._24_4_ = auVar51._24_4_ * auVar43._24_4_ * 0.0;
        auVar57._28_4_ = 0;
        auVar39 = vcvtdq2ps_avx(auVar49);
        auVar72._8_4_ = 0xb95e8083;
        auVar72._0_8_ = 0xb95e8083b95e8083;
        auVar72._12_4_ = 0xb95e8083;
        auVar72._16_4_ = 0xb95e8083;
        auVar72._20_4_ = 0xb95e8083;
        auVar72._24_4_ = 0xb95e8083;
        auVar72._28_4_ = 0xb95e8083;
        auVar50 = vfmadd231ps_fma(auVar57,auVar39,auVar72);
        auVar50 = vfmsub231ps_fma(ZEXT1632(auVar50),auVar73,auVar51);
        auVar6 = vcmpps_avx(ZEXT1632(auVar10),_DAT_004ef8c0,2);
        auVar9 = vsubps_avx(ZEXT1632(auVar50),auVar43);
        auVar52._8_4_ = 0x3f318000;
        auVar52._0_8_ = 0x3f3180003f318000;
        auVar52._12_4_ = 0x3f318000;
        auVar52._16_4_ = 0x3f318000;
        auVar52._20_4_ = 0x3f318000;
        auVar52._24_4_ = 0x3f318000;
        auVar52._28_4_ = 0x3f318000;
        auVar50 = vfmsub231ps_fma(auVar9,auVar52,auVar39);
        auVar6 = vorps_avx(auVar6,ZEXT1632(auVar50));
        fVar7 = (float)uVar17;
        fVar8 = (float)(uVar17 >> 0x20);
        auVar9._4_4_ = auVar6._4_4_ * fVar8;
        auVar9._0_4_ = auVar6._0_4_ * fVar7;
        auVar9._8_4_ = auVar6._8_4_ * -fVar38;
        auVar9._12_4_ = auVar6._12_4_ * -fVar38;
        auVar9._16_4_ = auVar6._16_4_ * fVar7;
        auVar9._20_4_ = auVar6._20_4_ * fVar8;
        auVar9._24_4_ = auVar6._24_4_ * -fVar38;
        auVar9._28_4_ = auVar6._28_4_;
        auVar44._8_4_ = 0x42b0c0a5;
        auVar44._0_8_ = 0x42b0c0a542b0c0a5;
        auVar44._12_4_ = 0x42b0c0a5;
        auVar44._16_4_ = 0x42b0c0a5;
        auVar44._20_4_ = 0x42b0c0a5;
        auVar44._24_4_ = 0x42b0c0a5;
        auVar44._28_4_ = 0x42b0c0a5;
        auVar6 = vminps_avx(auVar9,auVar44);
        auVar45._8_4_ = 0xc2b0c0a5;
        auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar45._12_4_ = 0xc2b0c0a5;
        auVar45._16_4_ = 0xc2b0c0a5;
        auVar45._20_4_ = 0xc2b0c0a5;
        auVar45._24_4_ = 0xc2b0c0a5;
        auVar45._28_4_ = 0xc2b0c0a5;
        auVar39 = vmaxps_avx(auVar6,auVar45);
        auVar46._8_4_ = 0x3fb8aa3b;
        auVar46._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar46._12_4_ = 0x3fb8aa3b;
        auVar46._16_4_ = 0x3fb8aa3b;
        auVar46._20_4_ = 0x3fb8aa3b;
        auVar46._24_4_ = 0x3fb8aa3b;
        auVar46._28_4_ = 0x3fb8aa3b;
        auVar50 = vfmadd213ps_fma(auVar46,auVar39,auVar73);
        auVar9 = vroundps_avx(ZEXT1632(auVar50),1);
        auVar6 = vcmpps_avx(ZEXT1632(auVar50),auVar9,1);
        auVar58._8_4_ = 0x3f800000;
        auVar58._0_8_ = 0x3f8000003f800000;
        auVar58._12_4_ = 0x3f800000;
        auVar58._16_4_ = 0x3f800000;
        auVar58._20_4_ = 0x3f800000;
        auVar58._24_4_ = 0x3f800000;
        auVar58._28_4_ = 0x3f800000;
        auVar6 = vandps_avx(auVar6,auVar58);
        auVar6 = vsubps_avx(auVar9,auVar6);
        auVar50 = vfmsub231ps_fma(auVar39,auVar6,auVar52);
        auVar47 = vfnmsub231ps_fma(ZEXT1632(auVar50),auVar6,auVar72);
        auVar39 = ZEXT1632(auVar47);
        auVar11._28_4_ = auVar9._28_4_;
        auVar11._0_28_ =
             ZEXT1628(CONCAT412(auVar47._12_4_ * auVar47._12_4_,
                                CONCAT48(auVar47._8_4_ * auVar47._8_4_,
                                         CONCAT44(auVar47._4_4_ * auVar47._4_4_,
                                                  auVar47._0_4_ * auVar47._0_4_))));
        auVar53._8_4_ = 0x39506967;
        auVar53._0_8_ = 0x3950696739506967;
        auVar53._12_4_ = 0x39506967;
        auVar53._16_4_ = 0x39506967;
        auVar53._20_4_ = 0x39506967;
        auVar53._24_4_ = 0x39506967;
        auVar53._28_4_ = 0x39506967;
        auVar59._8_4_ = 0x3ab743ce;
        auVar59._0_8_ = 0x3ab743ce3ab743ce;
        auVar59._12_4_ = 0x3ab743ce;
        auVar59._16_4_ = 0x3ab743ce;
        auVar59._20_4_ = 0x3ab743ce;
        auVar59._24_4_ = 0x3ab743ce;
        auVar59._28_4_ = 0x3ab743ce;
        auVar50 = vfmadd213ps_fma(auVar53,auVar39,auVar59);
        auVar60._8_4_ = 0x3c088908;
        auVar60._0_8_ = 0x3c0889083c088908;
        auVar60._12_4_ = 0x3c088908;
        auVar60._16_4_ = 0x3c088908;
        auVar60._20_4_ = 0x3c088908;
        auVar60._24_4_ = 0x3c088908;
        auVar60._28_4_ = 0x3c088908;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar39,auVar60);
        auVar61._8_4_ = 0x3d2aa9c1;
        auVar61._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar61._12_4_ = 0x3d2aa9c1;
        auVar61._16_4_ = 0x3d2aa9c1;
        auVar61._20_4_ = 0x3d2aa9c1;
        auVar61._24_4_ = 0x3d2aa9c1;
        auVar61._28_4_ = 0x3d2aa9c1;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar39,auVar61);
        auVar62._8_4_ = 0x3e2aaaaa;
        auVar62._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar62._12_4_ = 0x3e2aaaaa;
        auVar62._16_4_ = 0x3e2aaaaa;
        auVar62._20_4_ = 0x3e2aaaaa;
        auVar62._24_4_ = 0x3e2aaaaa;
        auVar62._28_4_ = 0x3e2aaaaa;
        auVar39 = ZEXT1632(auVar47);
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar39,auVar62);
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar39,auVar73);
        auVar10 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar11,auVar39);
        auVar50._0_4_ = (int)auVar6._0_4_;
        auVar50._4_4_ = (int)auVar6._4_4_;
        auVar50._8_4_ = (int)auVar6._8_4_;
        auVar50._12_4_ = (int)auVar6._12_4_;
        auVar41._16_4_ = (int)auVar6._16_4_;
        auVar41._0_16_ = auVar50;
        auVar41._20_4_ = (int)auVar6._20_4_;
        auVar41._24_4_ = (int)auVar6._24_4_;
        auVar41._28_4_ = (int)auVar6._28_4_;
        auVar47 = vpslld_avx(auVar50,0x17);
        auVar50 = vpslld_avx(auVar41._16_16_,0x17);
        auVar48._8_4_ = 0x3f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._12_4_ = 0x3f800000;
        auVar50 = vpaddd_avx(auVar50,auVar48);
        auVar47 = vpaddd_avx(auVar47,auVar48);
        auVar12._4_4_ = auVar47._4_4_ * *(float *)((long)*pauVar27 + 4);
        auVar12._0_4_ = auVar47._0_4_ * *(float *)*pauVar27;
        auVar12._8_4_ = auVar47._8_4_ * *(float *)((long)*pauVar27 + 8);
        auVar12._12_4_ = auVar47._12_4_ * *(float *)((long)*pauVar27 + 0xc);
        auVar12._16_4_ = auVar50._0_4_ * *(float *)((long)*pauVar27 + 0x10);
        auVar12._20_4_ = auVar50._4_4_ * *(float *)((long)*pauVar27 + 0x14);
        auVar12._24_4_ = auVar50._8_4_ * *(float *)((long)*pauVar27 + 0x18);
        auVar12._28_4_ = auVar50._12_4_;
        auVar50 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar10),auVar12);
        *pauVar27 = ZEXT1632(auVar50);
        ppp_Var23 = ppp_Var23 + 4;
        pauVar27 = pauVar27 + 1;
        lVar25 = lVar25 + 8;
      }
      lVar29 = sVar3 * sVar2 * (long)pMVar15;
      lVar22 = local_188.cstep * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
      for (; (int)lVar25 < iVar32; lVar25 = lVar25 + 1) {
        auVar50 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)(_func_int ***)pvVar35 +
                                                   lVar25 * 4 + lVar22 * (long)pMVar15)),local_128,
                                  ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var16[-3])));
        fVar38 = powf(auVar50._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var16[-3]));
        *(float *)((long)pvVar5 + lVar25 * 4 + lVar29) =
             fVar38 * *(float *)((long)pvVar5 + lVar25 * 4 + lVar29);
      }
      uVar33 = (uint)local_138;
    }
    piVar13 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_188.allocator == (Allocator *)0x0) goto LAB_002db0e1;
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    iVar32 = 0;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var16[-3]) != 1) goto LAB_002db0ee;
    piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
    local_188.data = local_118.data;
    local_188.refcount._0_4_ = (int)local_118.refcount;
    local_188.refcount._4_4_ = local_118.refcount._4_4_;
    local_188.elemsize._0_4_ = (undefined4)local_118.elemsize;
    local_188.elemsize._4_4_ = (undefined4)(local_118.elemsize >> 0x20);
    local_188.elempack = local_118.elempack;
    local_188.allocator = local_118.allocator;
    local_188.dims = local_118.dims;
    local_188.w = local_118.w;
    local_188.h = local_118.h;
    local_188.d = local_118.d;
    local_188.c = local_118.c;
    local_188.cstep = local_118.cstep;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
      pp_Var16 = this->_vptr_LRN_x86_fma;
    }
    p_Var20 = pp_Var16[-3];
    uVar33 = *(uint *)(&this->field_0xd4 + (long)p_Var20);
    uVar36 = uVar19;
    if (1 < (int)uVar33) {
      uVar33 = uVar33 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar32 = ~uVar33 + *(int *)(&this->field_0xd4 + (long)pp_Var16[-3]);
      copy_make_border(&local_118,&local_188,uVar33,iVar32,uVar33,iVar32,0,0.0,(Option *)&_space_ofs
                      );
      iVar32 = -100;
      if (((Allocator *)local_188.data == (Allocator *)0x0) ||
         ((long)local_188.c * local_188.cstep == 0)) {
        piVar13 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
        if (piVar13 == (int *)0x0) goto LAB_002db0ee;
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 != 0) goto LAB_002db0ee;
        if (local_188.allocator != (Allocator *)0x0) {
          (*(local_188.allocator)->_vptr_Allocator[3])();
          goto LAB_002db0ee;
        }
        goto LAB_002db142;
      }
      p_Var20 = this->_vptr_LRN_x86_fma[-3];
      uVar33 = *(uint *)(&this->field_0xd4 + (long)p_Var20);
      uVar36 = local_188.w;
    }
    uVar33 = uVar33 * uVar33;
    local_128._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var20);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar33,&local_199);
    piVar14 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var16 = this->_vptr_LRN_x86_fma;
    iVar32 = *(int *)(&this->field_0xd4 + (long)pp_Var16[-3]);
    iVar37 = uVar36 - iVar32;
    lVar25 = 0;
    iVar34 = 0;
    for (iVar26 = 0; iVar26 < iVar32; iVar26 = iVar26 + 1) {
      for (lVar29 = 0; iVar28 = (int)lVar29, iVar28 < iVar32; lVar29 = lVar29 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar25 + lVar29] = iVar34 + iVar28;
        iVar32 = *(int *)(&this->field_0xd4 + (long)pp_Var16[-3]);
      }
      iVar34 = iVar34 + iVar37 + iVar28;
      lVar25 = (int)lVar25 + lVar29;
    }
    local_b8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
    local_c0 = local_188.cstep * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
    local_a8 = (long)local_188.w * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize)
    ;
    uVar17 = (ulong)uVar19;
    if ((int)uVar19 < 1) {
      uVar17 = 0;
    }
    local_c8 = bottom_top_blob->data;
    pMVar15 = (Mat *)0x0;
    iVar32 = (int)local_198;
    local_198 = (Mat *)((ulong)local_198 & 0xffffffff);
    if (iVar32 < 1) {
      local_198 = pMVar15;
    }
    local_d0 = (Allocator *)local_188.data;
    local_98._0_4_ = 1.0 / (float)(int)uVar33;
    while (pMVar15 != local_140) {
      pvVar35 = (void *)(local_b8 * (long)pMVar15 + (long)local_c8);
      local_138 = (_func_int ***)((long)&local_d0->_vptr_Allocator + local_c0 * (long)pMVar15);
      pMVar18 = (Mat *)0x0;
      local_b0 = pMVar15;
      while (ppp_Var23 = local_138, pMVar18 != local_198) {
        lVar25 = local_a8 * (long)pMVar18;
        pp_Var16 = this->_vptr_LRN_x86_fma;
        local_130 = pMVar18;
        for (uVar24 = 0; uVar24 != uVar17; uVar24 = uVar24 + 1) {
          fVar38 = 0.0;
          for (uVar21 = 0; uVar33 != uVar21; uVar21 = uVar21 + 1) {
            fVar38 = fVar38 + *(float *)((long)ppp_Var23 +
                                        (long)piVar14[uVar21] * 4 + uVar24 * 4 + lVar25);
          }
          auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar38 * (float)local_128._0_4_)),
                                    ZEXT416((uint)local_98._0_4_),
                                    ZEXT416(*(uint *)(&local_190->field_0xe0 + (long)pp_Var16[-3])))
          ;
          fVar38 = powf(auVar50._0_4_,-*(float *)(&local_190->field_0xdc + (long)pp_Var16[-3]));
          *(float *)((long)pvVar35 + uVar24 * 4) = fVar38 * *(float *)((long)pvVar35 + uVar24 * 4);
        }
        pvVar35 = (void *)((long)pvVar35 + local_a0 * 4);
        this = local_190;
        pMVar18 = (Mat *)((long)&local_130->data + 1);
      }
      pMVar15 = (Mat *)((long)&local_b0->data + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    piVar13 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
LAB_002db0e1:
          free(local_188.data);
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar32 = 0;
LAB_002db0ee:
  piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar32;
}

Assistant:

int LRN_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}